

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

void __thiscall
t_py_generator::generate_py_struct_reader(t_py_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *ptVar2;
  bool bVar3;
  ostream *poVar4;
  pointer pptVar5;
  string *prefix;
  char *pcVar6;
  ostringstream result;
  string local_228;
  string local_208 [32];
  string local_1e8;
  string local_1c8;
  string local_1a8 [11];
  
  bVar3 = is_immutable(&tstruct->super_t_type);
  if (bVar3) {
    t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
    poVar4 = std::operator<<(out,(string *)local_1a8);
    poVar4 = std::operator<<(poVar4,"@classmethod");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_228,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_228);
    poVar4 = std::operator<<(poVar4,"def read(cls, iprot):");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)local_1a8);
  }
  else {
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    poVar4 = std::operator<<(poVar4,"def read(self, iprot):");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  bVar3 = is_immutable(&tstruct->super_t_type);
  pcVar6 = "self";
  if (bVar3) {
    pcVar6 = "cls";
  }
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,
                           "if iprot._fast_decode is not None and isinstance(iprot.trans, TTransport.CReadableTransport) and "
                          );
  poVar4 = std::operator<<(poVar4,pcVar6);
  poVar4 = std::operator<<(poVar4,".thrift_spec is not None:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  bVar3 = is_immutable(&tstruct->super_t_type);
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  if (bVar3) {
    pcVar6 = "return iprot._fast_decode(None, iprot, [cls, cls.thrift_spec])";
  }
  else {
    poVar4 = std::operator<<(poVar4,
                             "iprot._fast_decode(self, iprot, [self.__class__, self.thrift_spec])");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    pcVar6 = "return";
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"iprot.readStructBegin()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  bVar3 = is_immutable(&tstruct->super_t_type);
  if (bVar3) {
    for (pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar5 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      ptVar2 = *pptVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar4 = std::operator<<((ostream *)local_1a8,(string *)&ptVar2->name_);
      std::operator<<(poVar4," = ");
      if (ptVar2->value_ == (t_const_value *)0x0) {
        std::operator<<((ostream *)local_1a8,"None");
      }
      else {
        render_field_default_value_abi_cxx11_(&local_228,this,ptVar2);
        std::operator<<((ostream *)local_1a8,(string *)&local_228);
        std::__cxx11::string::~string((string *)&local_228);
      }
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      std::__cxx11::stringbuf::str();
      poVar4 = std::operator<<(poVar4,(string *)&local_228);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    }
  }
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"while True:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"(fname, ftype, fid) = iprot.readFieldBegin()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"if ftype == TType.STOP:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"break");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  bVar3 = true;
  for (pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar5 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    if (bVar3) {
      t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)local_1a8);
      std::operator<<(poVar4,"if ");
    }
    else {
      t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)local_1a8);
      std::operator<<(poVar4,"elif ");
    }
    std::__cxx11::string::~string((string *)local_1a8);
    poVar4 = std::operator<<(out,"fid == ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pptVar5)->key_);
    poVar4 = std::operator<<(poVar4,":");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    pcVar6 = "if ftype == ";
    poVar4 = std::operator<<(poVar4,"if ftype == ");
    type_to_enum_abi_cxx11_(local_1a8,(t_py_generator *)pcVar6,(*pptVar5)->type_);
    poVar4 = std::operator<<(poVar4,(string *)local_1a8);
    poVar4 = std::operator<<(poVar4,":");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_1a8);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    bVar3 = is_immutable(&tstruct->super_t_type);
    ptVar2 = *pptVar5;
    if (bVar3) {
      prefix = &local_1c8;
      std::__cxx11::string::string((string *)prefix,"",(allocator *)local_1a8);
      generate_deserialize_field(this,out,ptVar2,prefix);
    }
    else {
      prefix = &local_1e8;
      std::__cxx11::string::string((string *)prefix,"self.",(allocator *)local_1a8);
      generate_deserialize_field(this,out,ptVar2,prefix);
    }
    std::__cxx11::string::~string((string *)prefix);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
    poVar4 = std::operator<<(out,(string *)local_1a8);
    poVar4 = std::operator<<(poVar4,"else:");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_228,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_228);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_208,this);
    poVar4 = std::operator<<(poVar4,local_208);
    poVar4 = std::operator<<(poVar4,"iprot.skip(ftype)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)local_1a8);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    bVar3 = false;
  }
  t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)local_1a8);
  poVar4 = std::operator<<(poVar4,"else:");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_228,&this->super_t_generator);
  poVar4 = std::operator<<(poVar4,(string *)&local_228);
  (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_208,this);
  poVar4 = std::operator<<(poVar4,local_208);
  poVar4 = std::operator<<(poVar4,"iprot.skip(ftype)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)local_1a8);
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"iprot.readFieldEnd()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"iprot.readStructEnd()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  bVar3 = is_immutable(&tstruct->super_t_type);
  if (bVar3) {
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    poVar4 = std::operator<<(poVar4,"return cls(");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    for (pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar5 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,(string *)&(*pptVar5)->name_);
      poVar4 = std::operator<<(poVar4,"=");
      poVar4 = std::operator<<(poVar4,(string *)&(*pptVar5)->name_);
      poVar4 = std::operator<<(poVar4,",");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    poVar4 = std::operator<<(poVar4,")");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_py_generator::generate_py_struct_reader(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  if (is_immutable(tstruct)) {
    out << indent() << "@classmethod" << endl << indent() << "def read(cls, iprot):" << endl;
  } else {
    indent(out) << "def read(self, iprot):" << endl;
  }
  indent_up();

  const char* id = is_immutable(tstruct) ? "cls" : "self";

  indent(out) << "if iprot._fast_decode is not None "
                 "and isinstance(iprot.trans, TTransport.CReadableTransport) "
                 "and "
              << id << ".thrift_spec is not None:" << endl;
  indent_up();

  if (is_immutable(tstruct)) {
    indent(out) << "return iprot._fast_decode(None, iprot, [cls, cls.thrift_spec])" << endl;
  } else {
    indent(out) << "iprot._fast_decode(self, iprot, [self.__class__, self.thrift_spec])" << endl;
    indent(out) << "return" << endl;
  }
  indent_down();

  indent(out) << "iprot.readStructBegin()" << endl;
  
  if (is_immutable(tstruct)) {
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      t_field* tfield = *f_iter;
      std::ostringstream result;
      result << tfield->get_name() << " = ";
      if (tfield->get_value() != nullptr) {
        result << render_field_default_value(tfield);
      } else {
        result << "None";
      }
      indent(out) << result.str() << endl;
     }
  }

  // Loop over reading in fields
  indent(out) << "while True:" << endl;
  indent_up();

  // Read beginning field marker
  indent(out) << "(fname, ftype, fid) = iprot.readFieldBegin()" << endl;

  // Check for field STOP marker and break
  indent(out) << "if ftype == TType.STOP:" << endl;
  indent_up();
  indent(out) << "break" << endl;
  indent_down();

  // Switch statement on the field we are reading
  bool first = true;

  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
      out << indent() << "if ";
    } else {
      out << indent() << "elif ";
    }
    out << "fid == " << (*f_iter)->get_key() << ":" << endl;
    indent_up();
    indent(out) << "if ftype == " << type_to_enum((*f_iter)->get_type()) << ":" << endl;
    indent_up();
    if (is_immutable(tstruct)) {
      generate_deserialize_field(out, *f_iter);
    } else {
      generate_deserialize_field(out, *f_iter, "self.");
    }
    indent_down();
    out << indent() << "else:" << endl << indent() << indent_str() << "iprot.skip(ftype)" << endl;
    indent_down();
  }

  // In the default case we skip the field
  out << indent() << "else:" << endl << indent() << indent_str() << "iprot.skip(ftype)" << endl;

  // Read field end marker
  indent(out) << "iprot.readFieldEnd()" << endl;

  indent_down();

  indent(out) << "iprot.readStructEnd()" << endl;

  if (is_immutable(tstruct)) {
    indent(out) << "return cls(" << endl;
    indent_up();
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      indent(out) << (*f_iter)->get_name() << "=" << (*f_iter)->get_name() << "," << endl;
    }
    indent_down();
    indent(out) << ")" << endl;
  }

  indent_down();
  out << endl;
}